

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreateDescriptorKeyRequest * __thiscall
cfd::js::api::json::CreateDescriptorKeyRequest::GetKeyPathFromParentString_abi_cxx11_
          (CreateDescriptorKeyRequest *this,CreateDescriptorKeyRequest *obj)

{
  CreateDescriptorKeyRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->key_path_from_parent_);
  return this;
}

Assistant:

static std::string GetKeyPathFromParentString(  // line separate
      const CreateDescriptorKeyRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.key_path_from_parent_);
  }